

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::Function::RegisterLoopMerge(Function *this,uint32_t merge_id,uint32_t continue_id)

{
  BasicBlock *entry;
  mapped_type pBVar1;
  initializer_list<spvtools::val::BasicBlock_*> __l;
  initializer_list<spvtools::val::Construct_*> __l_00;
  initializer_list<spvtools::val::Construct_*> __l_01;
  BasicBlock *exit;
  bool bVar2;
  Construct *pCVar3;
  Construct *pCVar4;
  mapped_type *ppBVar5;
  mapped_type *pmVar6;
  key_type local_180;
  key_type local_178;
  BasicBlock *local_170;
  iterator local_168;
  size_type local_160;
  _Node_iterator_base<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_false>
  local_158;
  key_type local_150;
  _Node_iterator_base<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_false>
  local_148;
  BasicBlock *local_140;
  allocator<spvtools::val::Construct_*> local_131;
  Construct *local_130;
  iterator local_128;
  size_type local_120;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_118;
  allocator<spvtools::val::Construct_*> local_f9;
  Construct *local_f8;
  iterator local_f0;
  size_type local_e8;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_e0;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_c8;
  Construct local_b0;
  Construct *local_80;
  Construct *continue_construct;
  Construct local_60;
  Construct *local_30;
  Construct *loop_construct;
  BasicBlock *continue_target_block;
  BasicBlock *merge_block;
  uint32_t continue_id_local;
  uint32_t merge_id_local;
  Function *this_local;
  
  merge_block._0_4_ = continue_id;
  merge_block._4_4_ = merge_id;
  _continue_id_local = this;
  RegisterBlock(this,merge_id,false);
  RegisterBlock(this,(uint32_t)merge_block,false);
  continue_target_block =
       std::
       unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
       ::at(&this->blocks_,(key_type *)((long)&merge_block + 4));
  loop_construct =
       (Construct *)
       std::
       unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
       ::at(&this->blocks_,(key_type *)&merge_block);
  if (this->current_block_ == (BasicBlock *)0x0) {
    __assert_fail("current_block_ && \"RegisterLoopMerge must be called when called within a block\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                  ,0x4a,
                  "spv_result_t spvtools::val::Function::RegisterLoopMerge(uint32_t, uint32_t)");
  }
  BasicBlock::RegisterStructuralSuccessor(this->current_block_,continue_target_block);
  BasicBlock::RegisterStructuralSuccessor(this->current_block_,(BasicBlock *)loop_construct);
  BasicBlock::set_type(this->current_block_,kBlockTypeLoop);
  BasicBlock::set_type(continue_target_block,kBlockTypeMerge);
  BasicBlock::set_type((BasicBlock *)loop_construct,kBlockTypeContinue);
  exit = continue_target_block;
  entry = this->current_block_;
  memset(&continue_construct,0,0x18);
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::vector
            ((vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
             &continue_construct);
  Construct::Construct
            (&local_60,kLoop,entry,exit,
             (vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
             &continue_construct);
  pCVar3 = AddConstruct(this,&local_60);
  Construct::~Construct(&local_60);
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::~vector
            ((vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
             &continue_construct);
  pCVar4 = loop_construct;
  local_30 = pCVar3;
  memset(&local_c8,0,0x18);
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::vector
            (&local_c8);
  Construct::Construct(&local_b0,kContinue,(BasicBlock *)pCVar4,(BasicBlock *)0x0,&local_c8);
  pCVar4 = AddConstruct(this,&local_b0);
  Construct::~Construct(&local_b0);
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::~vector
            (&local_c8);
  local_f8 = local_30;
  local_f0 = &local_f8;
  local_e8 = 1;
  local_80 = pCVar4;
  std::allocator<spvtools::val::Construct_*>::allocator(&local_f9);
  __l_01._M_len = local_e8;
  __l_01._M_array = local_f0;
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::vector
            (&local_e0,__l_01,&local_f9);
  Construct::set_corresponding_constructs(pCVar4,&local_e0);
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::~vector
            (&local_e0);
  std::allocator<spvtools::val::Construct_*>::~allocator(&local_f9);
  pCVar4 = local_30;
  local_130 = local_80;
  local_128 = &local_130;
  local_120 = 1;
  std::allocator<spvtools::val::Construct_*>::allocator(&local_131);
  __l_00._M_len = local_120;
  __l_00._M_array = local_128;
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::vector
            (&local_118,__l_00,&local_131);
  Construct::set_corresponding_constructs(pCVar4,&local_118);
  std::vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::~vector
            (&local_118);
  std::allocator<spvtools::val::Construct_*>::~allocator(&local_131);
  pBVar1 = this->current_block_;
  local_140 = continue_target_block;
  ppBVar5 = std::
            unordered_map<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>_>
            ::operator[](&this->merge_block_header_,&local_140);
  *ppBVar5 = pBVar1;
  local_150 = (key_type)loop_construct;
  local_148._M_cur =
       (__node_type *)
       std::
       unordered_map<spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
       ::find(&this->continue_target_headers_,&local_150);
  local_158._M_cur =
       (__node_type *)
       std::
       unordered_map<spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
       ::end(&this->continue_target_headers_);
  bVar2 = std::__detail::operator==(&local_148,&local_158);
  if (bVar2) {
    local_170 = this->current_block_;
    local_168 = &local_170;
    local_160 = 1;
    local_178 = (key_type)loop_construct;
    pmVar6 = std::
             unordered_map<spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
             ::operator[](&this->continue_target_headers_,&local_178);
    __l._M_len = local_160;
    __l._M_array = local_168;
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    operator=(pmVar6,__l);
  }
  else {
    local_180 = (key_type)loop_construct;
    pmVar6 = std::
             unordered_map<spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
             ::operator[](&this->continue_target_headers_,&local_180);
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    push_back(pmVar6,&this->current_block_);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Function::RegisterLoopMerge(uint32_t merge_id,
                                         uint32_t continue_id) {
  RegisterBlock(merge_id, false);
  RegisterBlock(continue_id, false);
  BasicBlock& merge_block = blocks_.at(merge_id);
  BasicBlock& continue_target_block = blocks_.at(continue_id);
  assert(current_block_ &&
         "RegisterLoopMerge must be called when called within a block");
  current_block_->RegisterStructuralSuccessor(&merge_block);
  current_block_->RegisterStructuralSuccessor(&continue_target_block);

  current_block_->set_type(kBlockTypeLoop);
  merge_block.set_type(kBlockTypeMerge);
  continue_target_block.set_type(kBlockTypeContinue);
  Construct& loop_construct =
      AddConstruct({ConstructType::kLoop, current_block_, &merge_block});
  Construct& continue_construct =
      AddConstruct({ConstructType::kContinue, &continue_target_block});

  continue_construct.set_corresponding_constructs({&loop_construct});
  loop_construct.set_corresponding_constructs({&continue_construct});
  merge_block_header_[&merge_block] = current_block_;
  if (continue_target_headers_.find(&continue_target_block) ==
      continue_target_headers_.end()) {
    continue_target_headers_[&continue_target_block] = {current_block_};
  } else {
    continue_target_headers_[&continue_target_block].push_back(current_block_);
  }

  return SPV_SUCCESS;
}